

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void plain_array_suite::run(void)

{
  ctor();
  push_front();
  push_back();
  push_alternating();
  pop_front();
  pop_back();
  expand_front();
  remove_front();
  remove_front_n();
  remove_back();
  remove_back_n();
  assign_operator();
  assign_iterator();
  assign_initializer_list();
  return;
}

Assistant:

void run()
{
    ctor();
    push_front();
    push_back();
    push_alternating();
    pop_front();
    pop_back();
    expand_front();
    remove_front();
    remove_front_n();
    remove_back();
    remove_back_n();
    assign_operator();
    assign_iterator();
    assign_initializer_list();
}